

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

void testing::internal::PrintCharAndCodeTo<unsigned_char,unsigned_char>(uchar c,ostream *os)

{
  void *pvVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  undefined7 in_register_00000039;
  ulong uVar7;
  char local_41;
  uchar local_40;
  undefined7 uStack_3f;
  long local_38;
  
  uVar7 = CONCAT71(in_register_00000039,c);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  iVar5 = (int)uVar7;
  switch(uVar7 & 0xffffffff) {
  case 0:
    pcVar6 = "\\0";
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_0012477b_caseD_1:
    if (0x5e < iVar5 - 0x20U) {
      String::Format((char *)&local_40,"\\x%X",uVar7 & 0xffffffff);
      pvVar1 = (void *)CONCAT71(uStack_3f,local_40);
      if (pvVar1 == (void *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"(null)",6);
      }
      else if (local_38 != 0) {
        lVar4 = 0;
        do {
          if (*(char *)((long)pvVar1 + lVar4) == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(os,"\\0",2);
          }
          else {
            local_41 = *(char *)((long)pvVar1 + lVar4);
            std::__ostream_insert<char,std::char_traits<char>>(os,&local_41,1);
          }
          lVar4 = lVar4 + 1;
        } while (local_38 != lVar4);
      }
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
      bVar2 = true;
      goto LAB_0012480c;
    }
    pcVar6 = (char *)&local_40;
    lVar4 = 1;
    local_40 = c;
    goto LAB_00124801;
  case 7:
    pcVar6 = "\\a";
    break;
  case 8:
    pcVar6 = "\\b";
    break;
  case 9:
    pcVar6 = "\\t";
    break;
  case 10:
    pcVar6 = "\\n";
    break;
  case 0xb:
    pcVar6 = "\\v";
    break;
  case 0xc:
    pcVar6 = "\\f";
    break;
  case 0xd:
    pcVar6 = "\\r";
    break;
  default:
    if (iVar5 == 0x27) {
      pcVar6 = "\\\'";
    }
    else {
      if (iVar5 != 0x5c) goto switchD_0012477b_caseD_1;
      pcVar6 = "\\\\";
    }
  }
  lVar4 = 2;
LAB_00124801:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar4);
  bVar2 = false;
LAB_0012480c:
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  if (c != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    String::Format((char *)&local_40,"%d",uVar7 & 0xffffffff);
    pcVar6 = (char *)CONCAT71(uStack_3f,local_40);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar3);
      operator_delete__(pcVar6);
    }
    if (9 < c && !bVar2) {
      String::Format((char *)&local_40,", 0x%X",uVar7 & 0xffffffff);
      pcVar6 = (char *)CONCAT71(uStack_3f,local_40);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar3);
        operator_delete__(pcVar6);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << String::Format("%d", c).c_str();

  // For more convenience, we print c's code again in hexidecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << String::Format(", 0x%X",
                          static_cast<UnsignedChar>(c)).c_str();
  }
  *os << ")";
}